

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool google::protobuf::EnumDescriptorProto::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = internal::AllAreInitialized<google::protobuf::EnumValueDescriptorProto>
                    ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)
                     &msg[1]._internal_metadata_);
  if (bVar1) {
    if (((ulong)msg[1]._vptr_MessageLite & 2) != 0) {
      bVar1 = EnumOptions::IsInitializedImpl((MessageLite *)msg[6]._internal_metadata_.ptr_);
      if (!bVar1) goto LAB_00177f5c;
    }
    bVar1 = true;
  }
  else {
LAB_00177f5c:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool EnumDescriptorProto::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const EnumDescriptorProto&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_value()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.options_->IsInitialized()) return false;
  }
  return true;
}